

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libperfetto-connector.cpp
# Opt level: O1

void KokkosTools::PerfettoConnector::kokkosp_begin_parallel_for
               (char *name,uint32_t dev_id,uint64_t *param_3)

{
  anon_class_8_1_dda845c3 local_28;
  uint32_t local_1c;
  char *local_18;
  anon_class_16_2_38ee1b33 local_10;
  
  local_10.name = &local_18;
  local_10.dev_id = &local_1c;
  local_28.callback = &local_10;
  if (perfetto::internal::g_category_state_storage != 0) {
    local_1c = dev_id;
    local_18 = name;
    anon_func::anon_class_8_1_dda845c3::operator()
              (&local_28,(uint)perfetto::internal::g_category_state_storage);
  }
  return;
}

Assistant:

void kokkosp_begin_parallel_for(const char *name, const uint32_t dev_id,
                                uint64_t *) {
  TRACE_EVENT_BEGIN("kokkos.parallel_for", perfetto::StaticString{name},
                    "device", dev_id);
}